

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_call_arity_tests.cpp
# Opt level: O1

void __thiscall
GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::
test_method(generic_catcher_2_param_with_multiple_nested_handlers_0 *this)

{
  undefined4 *puVar1;
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
  catcher;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_2_param_with_multiple_nested_handlers_0)
{
   using namespace mittens;

   {
      auto catcher = generic_handler<void>(-1,
                        generic_handler<int>(-2,
                           generic_handler<float>(-3)));

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-2, catcher.handleException());
      }
   }

   {
      struct MyException1 { };
      auto catcher = all_catcher(-1,
                        generic_handler<int>(-2,
                           generic_handler<MyException1>(-3)));

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-2, catcher.handleException());
      }
   }
}